

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void __thiscall duckdb::ListBindData::ListBindData(ListBindData *this,LogicalType *stype_p)

{
  LogicalType *other;
  LogicalType type;
  LogicalType local_30;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__ListBindData_027cb008;
  LogicalType::LogicalType(&this->stype,stype_p);
  (this->functions).initial_capacity = 4;
  (this->functions).child_functions.
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functions).child_functions.
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions).child_functions.
  super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  super__Vector_base<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  other = ListType::GetChildType(stype_p);
  LogicalType::LogicalType(&local_30,other);
  GetSegmentDataFunctions(&this->functions,&local_30);
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

ListBindData::ListBindData(const LogicalType &stype_p) : stype(stype_p) {
	// always unnest once because the result vector is of type LIST
	auto type = ListType::GetChildType(stype_p);
	GetSegmentDataFunctions(functions, type);
}